

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcServerResponse> * __thiscall
kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcServerResponse>::operator=
          (Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcServerResponse> *this,
          Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcServerResponse> *other)

{
  Disposer *this_00;
  RpcServerResponse *object;
  RpcServerResponse *ptrCopy;
  Disposer *disposerCopy;
  Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcServerResponse> *other_local;
  Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcServerResponse> *this_local;
  
  this_00 = this->disposer;
  object = this->ptr;
  this->disposer = other->disposer;
  this->ptr = other->ptr;
  other->ptr = (RpcServerResponse *)0x0;
  if (object != (RpcServerResponse *)0x0) {
    Disposer::dispose<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcServerResponse>
              (this_00,object);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }